

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void scale_to(values_t *values,double length)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  iterator i_1;
  double *pdVar4;
  size_type i;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  
  pdVar4 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = 0;
  lVar7 = 0;
  for (lVar5 = 0; dVar1 = pdVar4[lVar7], (long)pdVar2 - (long)pdVar4 >> 3 != lVar5;
      lVar5 = lVar5 + 1) {
    dVar8 = pdVar4[lVar5];
    lVar3 = lVar5;
    if (dVar1 <= dVar8) {
      lVar3 = lVar7;
    }
    lVar7 = lVar3;
    lVar3 = lVar5;
    if (dVar8 < pdVar4[lVar6] || dVar8 == pdVar4[lVar6]) {
      lVar3 = lVar6;
    }
    lVar6 = lVar3;
  }
  dVar8 = pdVar4[lVar6] - dVar1;
  for (; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
    dVar9 = 0.0;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      dVar9 = ((*pdVar4 - dVar1) * length) / dVar8;
    }
    *pdVar4 = dVar9;
  }
  return;
}

Assistant:

void scale_to(values_t& values, double length = 1.0)
{
    size_t min_v = 0;
    size_t max_v = 0;
    for (values_t::size_type i = 0; i < values.size(); i++)
    {
        if (values[min_v] > values[i])
        {
            min_v = i;
        }
        if (values[max_v] < values[i])
        {
            max_v = i;
        }
    }

    double min = values[min_v];
    double max = values[max_v] - min;
    for (values_t::iterator i = values.begin(); i != values.end(); i++)
    {
        if (0 != max)
        {
            *i = length*(*i - min)/max;
        } else
        {
            *i = 0;
        }
    }
}